

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ImageButtonEx
               (ImGuiID id,ImTextureID texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
               ImVec2 *padding,ImVec4 *bg_col,ImVec4 *tint_col)

{
  undefined8 uVar1;
  ImVec2 p_min;
  bool bVar2;
  byte bVar3;
  ImU32 IVar4;
  ImVec2 *in_RCX;
  ImVec4 *in_RSI;
  ImVec2 *in_R8;
  ImRect *in_R9;
  float v;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  long in_stack_00000008;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  ImDrawFlags in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff28;
  ImDrawList *uv_max;
  ImVec4 *in_stack_ffffffffffffff30;
  ImRect *in_stack_ffffffffffffff38;
  ImDrawList *in_stack_ffffffffffffff40;
  ImDrawList *in_stack_ffffffffffffff48;
  ImGuiButtonFlags in_stack_ffffffffffffff54;
  undefined4 uVar12;
  ImVec2 *min;
  bool *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  ImGuiID id_00;
  ImRect *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  float rounding;
  ImU32 IVar13;
  undefined1 in_stack_ffffffffffffff94;
  byte in_stack_ffffffffffffff96;
  byte in_stack_ffffffffffffff97;
  ImVec2 local_58;
  ImRect local_50;
  ImGuiWindow *local_40;
  ImGuiContext *pIVar14;
  bool local_1;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  
  rounding = (float)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  id_00 = (ImGuiID)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  pIVar14 = GImGui;
  local_40 = GetCurrentWindow();
  if ((local_40->SkipItems & 1U) == 0) {
    min = &(local_40->DC).CursorPos;
    auVar5._0_8_ = ::operator+((ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                               (ImVec2 *)0x5a7614);
    auVar5._8_56_ = extraout_var;
    vmovlpd_avx(auVar5._0_16_);
    auVar6._0_8_ = ::operator*((ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0.0);
    auVar6._8_56_ = extraout_var_00;
    vmovlpd_avx(auVar6._0_16_);
    auVar7._0_8_ = ::operator+((ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                               (ImVec2 *)0x5a7650);
    auVar7._8_56_ = extraout_var_01;
    local_58 = (ImVec2)vmovlpd_avx(auVar7._0_16_);
    ImRect::ImRect(&local_50,min,&local_58);
    ItemSize((ImRect *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c);
    bVar2 = ItemAdd((ImRect *)in_stack_ffffffffffffff48,
                    (ImGuiID)((ulong)in_stack_ffffffffffffff40 >> 0x20),in_stack_ffffffffffffff38,
                    (ImGuiItemFlags)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    if (bVar2) {
      bVar3 = ButtonBehavior(in_stack_ffffffffffffff70,id_00,in_stack_ffffffffffffff60,(bool *)min,
                             in_stack_ffffffffffffff54);
      if (((in_stack_ffffffffffffff96 & 1) == 0) || ((in_stack_ffffffffffffff97 & 1) == 0)) {
        uVar12 = 0x15;
        if ((in_stack_ffffffffffffff97 & 1) != 0) {
          uVar12 = 0x16;
        }
      }
      else {
        uVar12 = 0x17;
      }
      IVar4 = GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                          SUB84(in_stack_ffffffffffffff30,0));
      RenderNavHighlight(in_R9,(ImGuiID)((ulong)pIVar14 >> 0x20),(ImGuiNavHighlightFlags)pIVar14);
      IVar13 = IVar4;
      v = ImMin<float>((in_R9->Min).x,(in_R9->Min).y);
      ImClamp<float>(v,0.0,(pIVar14->Style).FrameRounding);
      p_min.y._0_1_ = in_stack_ffffffffffffff94;
      p_min.x = (float)IVar13;
      p_min.y._1_1_ = bVar3;
      p_min.y._2_1_ = in_stack_ffffffffffffff96;
      p_min.y._3_1_ = in_stack_ffffffffffffff97;
      RenderFrame(p_min,local_50.Min,(ImU32)local_50.Max.y,local_50.Max.x._3_1_,rounding);
      if (0.0 < *(float *)(in_stack_00000008 + 0xc)) {
        in_stack_ffffffffffffff48 = local_40->DrawList;
        auVar8._0_8_ = ::operator+((ImVec2 *)
                                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                   (ImVec2 *)0x5a77e8);
        auVar8._8_56_ = extraout_var_02;
        vmovlpd_avx(auVar8._0_16_);
        auVar9._0_8_ = ::operator-((ImVec2 *)
                                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                   (ImVec2 *)0x5a7803);
        auVar9._8_56_ = extraout_var_03;
        vmovlpd_avx(auVar9._0_16_);
        GetColorU32(in_stack_ffffffffffffff30);
        ImDrawList::AddRectFilled
                  (in_stack_ffffffffffffff40,&in_stack_ffffffffffffff38->Min,
                   (ImVec2 *)in_stack_ffffffffffffff30,
                   (ImU32)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                   (float)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
      }
      uv_max = local_40->DrawList;
      auVar10._0_8_ =
           ::operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (ImVec2 *)0x5a7869);
      auVar10._8_56_ = extraout_var_04;
      vmovlpd_avx(auVar10._0_16_);
      auVar11._0_8_ =
           ::operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (ImVec2 *)0x5a7884);
      auVar11._8_56_ = extraout_var_05;
      uVar1 = vmovlpd_avx(auVar11._0_16_);
      IVar13 = (ImU32)uVar1;
      GetColorU32(in_RSI);
      ImDrawList::AddImage
                ((ImDrawList *)CONCAT44(uVar12,IVar4),in_stack_ffffffffffffff48,in_R8,in_RCX,
                 (ImVec2 *)in_RSI,(ImVec2 *)uv_max,IVar13);
      local_1 = (bool)(bVar3 & 1);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ImageButtonEx(ImGuiID id, ImTextureID texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, const ImVec2& padding, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size + padding * 2);
    ItemSize(bb);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, ImClamp((float)ImMin(padding.x, padding.y), 0.0f, g.Style.FrameRounding));
    if (bg_col.w > 0.0f)
        window->DrawList->AddRectFilled(bb.Min + padding, bb.Max - padding, GetColorU32(bg_col));
    window->DrawList->AddImage(texture_id, bb.Min + padding, bb.Max - padding, uv0, uv1, GetColorU32(tint_col));

    return pressed;
}